

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int is_rect_part_allowed
              (AV1_COMP *cpi,PartitionSearchState *part_search_state,active_edge_info *active_edge,
              RECT_PART_TYPE rect_part,int mi_pos)

{
  int iVar1;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  int is_part_allowed;
  PartitionBlkParams *blk_params;
  undefined1 local_2e;
  undefined1 local_2d;
  
  local_2d = false;
  if (((*(int *)(in_RSI + 0x118) == 0) &&
      (local_2d = false, *(int *)(in_RSI + 0x120 + (ulong)in_CL * 4) != 0)) &&
     (local_2d = false, *(int *)(in_RSI + 0x130 + (ulong)in_CL * 4) == 0)) {
    local_2e = true;
    if (*(int *)(in_RSI + 0x128) == 0) {
      iVar1 = (**(code **)(in_RDX + (ulong)in_CL * 8))(in_RDI,in_R8D,*(undefined4 *)(in_RSI + 8));
      local_2e = iVar1 != 0;
    }
    local_2d = local_2e;
  }
  return (uint)local_2d;
}

Assistant:

static inline int is_rect_part_allowed(
    const AV1_COMP *cpi, const PartitionSearchState *part_search_state,
    const active_edge_info *active_edge, RECT_PART_TYPE rect_part,
    const int mi_pos) {
  const PartitionBlkParams *blk_params = &part_search_state->part_blk_params;
  const int is_part_allowed =
      (!part_search_state->terminate_partition_search &&
       part_search_state->partition_rect_allowed[rect_part] &&
       !part_search_state->prune_rect_part[rect_part] &&
       (part_search_state->do_rectangular_split ||
        active_edge[rect_part](cpi, mi_pos, blk_params->mi_step)));
  return is_part_allowed;
}